

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model_removeImportedUnitsByIndex_Test::TestBody(Model_removeImportedUnitsByIndex_Test *this)

{
  Message MVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ModelPtr model;
  long *local_58;
  long *local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40 [8];
  AssertionResult local_38;
  long local_28 [2];
  ulong local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  commonSetupImportedUnits();
  MVar1 = (Message)libcellml::Model::removeUnits(local_18);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50._0_1_ = MVar1;
  if (MVar1 == (Message)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(char *)&local_50,"model->removeUnits(0)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x356,(char *)CONCAT71(local_38._1_7_,local_38.success_));
    testing::internal::AssertHelper::operator=(local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    if ((long *)CONCAT71(local_38._1_7_,local_38.success_) != local_28) {
      operator_delete((long *)CONCAT71(local_38._1_7_,local_38.success_),local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar2 = libcellml::Model::removeUnits(local_18);
  local_50 = (long *)CONCAT71(local_50._1_7_,cVar2);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(char *)&local_50,"model->removeUnits(0)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x357,(char *)CONCAT71(local_38._1_7_,local_38.success_));
    testing::internal::AssertHelper::operator=(local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_40);
    if ((long *)CONCAT71(local_38._1_7_,local_38.success_) != local_28) {
      operator_delete((long *)CONCAT71(local_38._1_7_,local_38.success_),local_28[0] + 1);
    }
    if (local_58 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_58 != (long *)0x0)) {
        (**(code **)(*local_58 + 8))();
      }
      local_58 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50 = (long *)0x0;
  local_58 = (long *)libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_38,"size_t(0)","model->unitsCount()",(unsigned_long *)&local_50,
             (unsigned_long *)&local_58);
  if (local_38.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_38.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x359,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_50 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_50 != (long *)0x0)) {
        (**(code **)(*local_50 + 8))();
      }
      local_50 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

TEST(Model, removeImportedUnitsByIndex)
{
    auto model = commonSetupImportedUnits();

    EXPECT_TRUE(model->removeUnits(0));
    EXPECT_TRUE(model->removeUnits(0));

    EXPECT_EQ(size_t(0), model->unitsCount());
}